

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O0

void __thiscall
qclab::qgates::SWAP<double>::apply
          (SWAP<double> *this,Side side,Op op,int nbQubits,SquareMatrix<double> *matrix,int offset)

{
  int control;
  int target;
  int64_t iVar1;
  const_reference pvVar2;
  undefined1 local_60 [8];
  CNOT<double> cnot10;
  CNOT<double> cnot01;
  int qubit1;
  int qubit0;
  int offset_local;
  SquareMatrix<double> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  SWAP<double> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::SWAP<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  iVar1 = dense::SquareMatrix<double>::size(matrix);
  if (iVar1 != 1 << ((byte)nbQubits & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x25,
                  "virtual void qclab::qgates::SWAP<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,0);
  control = *pvVar2 + offset;
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,1);
  target = *pvVar2 + offset;
  if (nbQubits <= control) {
    __assert_fail("qubit0 < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::SWAP<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
                 );
  }
  if (target < nbQubits) {
    CX<double>::CX((CX<double> *)&cnot10.gate_,control,target,1);
    CX<double>::CX((CX<double> *)local_60,target,control,1);
    CX<double>::apply((CX<double> *)&cnot10.gate_,side,op,nbQubits,matrix,0);
    CX<double>::apply((CX<double> *)local_60,side,op,nbQubits,matrix,0);
    CX<double>::apply((CX<double> *)&cnot10.gate_,side,op,nbQubits,matrix,0);
    CX<double>::~CX((CX<double> *)local_60);
    CX<double>::~CX((CX<double> *)&cnot10.gate_);
    return;
  }
  __assert_fail("qubit1 < nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                ,0x28,
                "virtual void qclab::qgates::SWAP<double>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = double]"
               );
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }